

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O0

void leb_DecodeNodeAttributeArray(leb_Node node,int attributeArraySize,float (*attributeArray) [3])

{
  float fVar1;
  int local_60;
  int i;
  undefined8 local_54;
  float attributeVector [3];
  lebMatrix3x3 m;
  float (*attributeArray_local) [3];
  int attributeArraySize_local;
  leb_Node node_local;
  
  unique0x100001bf = attributeArray;
  if (0 < attributeArraySize) {
    leb__DecodeTransformationMatrix(node,(float (*) [3])(attributeVector + 1));
    for (local_60 = 0; local_60 < attributeArraySize; local_60 = local_60 + 1) {
      local_54 = *(undefined8 *)stack0xffffffffffffffe0[local_60];
      attributeVector[0] = stack0xffffffffffffffe0[local_60][2];
      fVar1 = leb__DotProduct(3,attributeVector + 1,(float *)&local_54);
      stack0xffffffffffffffe0[local_60][0] = fVar1;
      fVar1 = leb__DotProduct(3,m[0] + 1,(float *)&local_54);
      stack0xffffffffffffffe0[local_60][1] = fVar1;
      fVar1 = leb__DotProduct(3,m[1] + 1,(float *)&local_54);
      stack0xffffffffffffffe0[local_60][2] = fVar1;
    }
    return;
  }
  __assert_fail("attributeArraySize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/LongestEdgeBisection.h"
                ,0x4c4,"void leb_DecodeNodeAttributeArray(const leb_Node, int, float (*)[3])");
}

Assistant:

LEBDEF void
leb_DecodeNodeAttributeArray(
    const leb_Node node,
    int attributeArraySize,
    float attributeArray[][3]
) {
    LEB_ASSERT(attributeArraySize > 0);

    lebMatrix3x3 m;
    float attributeVector[3];

    leb__DecodeTransformationMatrix(node, m);

    for (int i = 0; i < attributeArraySize; ++i) {
        memcpy(attributeVector, attributeArray[i], sizeof(attributeVector));
        attributeArray[i][0] = leb__DotProduct(3, m[0], attributeVector);
        attributeArray[i][1] = leb__DotProduct(3, m[1], attributeVector);
        attributeArray[i][2] = leb__DotProduct(3, m[2], attributeVector);
    }
}